

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchSCHashTable.c
# Opt level: O3

int Fxch_SCHashTableRemove
              (Fxch_SCHashTable_t *pSCHashTable,Vec_Wec_t *vCubes,uint32_t SubCubeID,uint32_t iCube,
              uint32_t iLit0,uint32_t iLit1,char fUpdate)

{
  Fxch_SCHashTable_Entry_t *pFVar1;
  uint32_t uVar2;
  Fxch_SubCube_t *pFVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Wec_t *pVVar6;
  Vec_Int_t *pVVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  Fxch_SubCube_t *pSCData0;
  long lVar11;
  int *piVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  Fxch_SubCube_t *pSCData1;
  uint uVar21;
  ulong uVar22;
  int local_74;
  
  uVar8 = (SubCubeID * -0x3361d2af >> 0x11 | SubCubeID * 0x16a88000) * 0x1b873593 ^ 0x9747b28c;
  uVar8 = (uVar8 << 0xd | uVar8 >> 0x13) * 5 + 0xe6546b64;
  uVar8 = (uVar8 >> 0x10 ^ uVar8 ^ 4) * -0x7a143595;
  uVar8 = (uVar8 >> 0xd ^ uVar8) * -0x3d4d51cb;
  uVar8 = (uVar8 >> 0x10 ^ uVar8) & pSCHashTable->SizeMask;
  pFVar1 = pSCHashTable->pBins + uVar8;
  uVar8 = *(uint *)&pSCHashTable->pBins[uVar8].field_0x8;
  uVar9 = uVar8 & 0xffff;
  if (uVar9 != 1) {
    if (uVar9 != 0) {
      lVar20 = 0;
      uVar22 = 0;
      do {
        if (*(uint32_t *)((long)&pFVar1->vSCData->iCube + lVar20) == iCube) {
          if ((uVar9 != 0) && (uVar9 * 0xc != (int)lVar20)) {
            pFVar3 = pFVar1->vSCData;
            pSCData0 = (Fxch_SubCube_t *)((long)&pFVar3->Id + lVar20);
            uVar13 = 0;
            local_74 = 0;
            goto LAB_004ca11a;
          }
          break;
        }
        uVar22 = uVar22 + 1;
        lVar20 = lVar20 + 0xc;
      } while ((ulong)(uVar9 * 4) * 3 != lVar20);
    }
    __assert_fail("( iEntry != (int)pBin->Size ) && ( pBin->Size != 0 )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchSCHashTable.c"
                  ,300,
                  "int Fxch_SCHashTableRemove(Fxch_SCHashTable_t *, Vec_Wec_t *, uint32_t, uint32_t, uint32_t, uint32_t, char)"
                 );
  }
  uVar8 = uVar8 & 0xffff0000;
  local_74 = 0;
  goto LAB_004ca45f;
LAB_004ca11a:
  do {
    if (uVar22 == uVar13) goto LAB_004ca3d1;
    iVar10 = pSCHashTable->pFxchMan->nSizeOutputID;
    uVar8 = *(int *)((long)&pFVar3->iCube + lVar20) * iVar10;
    if ((int)uVar8 < 0) {
LAB_004ca472:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    pVVar4 = pSCHashTable->pFxchMan->vOutputID;
    uVar9 = pVVar4->nSize;
    if ((int)uVar9 <= (int)uVar8) goto LAB_004ca472;
    pSCData1 = pFVar1->vSCData + uVar13;
    uVar21 = iVar10 * pSCData1->iCube;
    if (((int)uVar21 < 0) || (uVar9 <= uVar21)) goto LAB_004ca472;
    piVar5 = pVVar4->pArray;
    if (*(uint *)(&pFVar3->field_0x8 + lVar20) < 0x10000) {
      if (*(uint *)&pSCData1->field_0x8 < 0x10000) {
LAB_004ca1a0:
        iVar10 = Fxch_SCHashTableEntryCompare(pSCHashTable,vCubes,pSCData0,pSCData1);
        if ((((iVar10 != 0) && (*(short *)(&pFVar3->field_0x8 + lVar20) != 0)) &&
            (*(short *)&pSCData1->field_0x8 != 0)) &&
           (iVar10 = Fxch_DivCreate(pSCHashTable->pFxchMan,pSCData1,pSCData0), -1 < iVar10)) {
          lVar11 = (long)pSCHashTable->pFxchMan->nSizeOutputID;
          if (lVar11 < 1) {
LAB_004ca4b0:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          lVar16 = 0;
          iVar18 = 0;
          do {
            uVar9 = piVar5[(ulong)uVar21 + lVar16] & piVar5[(ulong)uVar8 + lVar16];
            uVar9 = (uVar9 >> 1 & 0x55555555) + (uVar9 & 0x55555555);
            uVar9 = (uVar9 >> 2 & 0x33333333) + (uVar9 & 0x33333333);
            uVar9 = (uVar9 >> 4 & 0x7070707) + (uVar9 & 0x7070707);
            uVar9 = (uVar9 >> 8 & 0xf000f) + (uVar9 & 0xf000f);
            iVar14 = (uVar9 >> 0x10) + iVar18;
            iVar18 = (uVar9 & 0xffff) + iVar14;
            lVar16 = lVar16 + 1;
          } while (lVar11 != lVar16);
          if (iVar18 == 0) goto LAB_004ca4b0;
          iVar14 = iVar14 + (uVar9 & 0x1f);
          do {
            uVar8 = Fxch_DivRemove(pSCHashTable->pFxchMan,(int)fUpdate,0,iVar10);
            iVar14 = iVar14 + -1;
          } while (iVar14 != 0);
          if (((int)uVar8 < 0) ||
             (pVVar6 = pSCHashTable->pFxchMan->vDivCubePairs, pVVar6->nSize <= (int)uVar8))
          goto LAB_004ca4b0;
          pVVar7 = pVVar6->pArray;
          pVVar4 = pVVar7 + uVar8;
          uVar8 = pVVar7[uVar8].nSize;
          uVar17 = (ulong)uVar8;
          if (1 < (int)uVar8) {
            piVar5 = pVVar4->pArray;
            uVar15 = 0;
            piVar12 = piVar5 + 1;
            do {
              uVar2 = *(uint32_t *)((long)&pFVar3->iCube + lVar20);
              if (((piVar5[uVar15] == pSCData1->iCube) && (piVar5[uVar15 + 1] == uVar2)) ||
                 ((piVar5[uVar15] == uVar2 && (piVar5[uVar15 + 1] == pSCData1->iCube)))) {
                uVar19 = uVar15 | 1;
                uVar8 = (int)uVar17 - 1;
                pVVar4->nSize = uVar8;
                if (uVar19 < uVar8) {
                  do {
                    piVar5[uVar19] = (piVar5 + 1)[uVar19];
                    uVar19 = uVar19 + 1;
                    uVar8 = pVVar4->nSize;
                  } while ((int)uVar19 < (int)uVar8);
                }
                if ((long)(int)uVar8 <= (long)uVar15) {
                  __assert_fail("i >= 0 && i < Vec_IntSize(p)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                ,0x40a,"void Vec_IntDrop(Vec_Int_t *, int)");
                }
                uVar17 = (ulong)(uVar8 - 1);
                pVVar4->nSize = uVar8 - 1;
                if (uVar15 < uVar17) {
                  lVar11 = 0;
                  do {
                    piVar12[lVar11 + -1] = piVar12[lVar11];
                    uVar17 = (ulong)(uint)pVVar4->nSize;
                    lVar11 = lVar11 + 1;
                  } while ((int)lVar11 + (int)uVar15 < pVVar4->nSize);
                }
              }
              uVar15 = uVar15 + 2;
              piVar12 = piVar12 + 2;
              uVar8 = (uint)uVar17;
            } while ((int)((uint)uVar15 | 1) < (int)uVar8);
          }
          if (uVar8 == 0) {
            if (pVVar4->pArray != (int *)0x0) {
              free(pVVar4->pArray);
              pVVar4->pArray = (int *)0x0;
            }
            pVVar4->nCap = 0;
            pVVar4->nSize = 0;
          }
          local_74 = local_74 + 1;
        }
      }
    }
    else if (0xffff < *(uint *)&pSCData1->field_0x8) goto LAB_004ca1a0;
LAB_004ca3d1:
    uVar13 = uVar13 + 1;
  } while (uVar13 < *(ushort *)&pFVar1->field_0x8);
  memmove((void *)((long)&pFVar1->vSCData->Id + lVar20),
          (void *)((long)&pFVar1->vSCData[1].Id + lVar20),
          (long)(int)(~(uint)uVar22 + (uint)*(ushort *)&pFVar1->field_0x8) * 0xc);
  uVar8 = *(uint *)&pFVar1->field_0x8 & 0xffff0000 | *(uint *)&pFVar1->field_0x8 - 1 & 0xffff;
LAB_004ca45f:
  *(uint *)&pFVar1->field_0x8 = uVar8;
  return local_74;
}

Assistant:

int Fxch_SCHashTableRemove( Fxch_SCHashTable_t* pSCHashTable,
                            Vec_Wec_t* vCubes,
                            uint32_t SubCubeID,
                            uint32_t iCube,
                            uint32_t iLit0,
                            uint32_t iLit1,
                            char fUpdate )
{
    int iEntry;
    int Pairs = 0;
    uint32_t BinID;
    Fxch_SCHashTable_Entry_t* pBin;
    Fxch_SubCube_t* pEntry;
    int idx;

    MurmurHash3_x86_32( ( void* ) &SubCubeID, sizeof( int ), 0x9747b28c, &BinID);

    pBin = Fxch_SCHashTableBin( pSCHashTable, BinID );

    if ( pBin->Size == 1 )
    {
        pBin->Size = 0;
        return 0;
    }

    for ( iEntry = 0; iEntry < (int)pBin->Size; iEntry++ )
        if ( pBin->vSCData[iEntry].iCube == iCube )
            break;

    assert( ( iEntry != (int)pBin->Size ) && ( pBin->Size != 0 ) );

    pEntry = &( pBin->vSCData[iEntry] );
    for ( idx = 0; idx < (int)pBin->Size; idx++ )
    if ( idx != iEntry )
    {
        int Base,
            iDiv = -1;

        int i, z,
            iCube0,
            iCube1;

        Fxch_SubCube_t* pNextEntry = &( pBin->vSCData[idx] );
        Vec_Int_t* vDivCubePairs;
        int* pOutputID0 = Vec_IntEntryP( pSCHashTable->pFxchMan->vOutputID, pEntry->iCube * pSCHashTable->pFxchMan->nSizeOutputID );
        int* pOutputID1 = Vec_IntEntryP( pSCHashTable->pFxchMan->vOutputID, pNextEntry->iCube * pSCHashTable->pFxchMan->nSizeOutputID );
        int Result = 0;

        if ( (pEntry->iLit1 != 0 && pNextEntry->iLit1 == 0) || (pEntry->iLit1 == 0 && pNextEntry->iLit1 != 0)  )
            continue;

        if ( !Fxch_SCHashTableEntryCompare( pSCHashTable, vCubes, pEntry, pNextEntry )
             || pEntry->iLit0 == 0
             || pNextEntry->iLit0 == 0 )
            continue;

        Base = Fxch_DivCreate( pSCHashTable->pFxchMan, pNextEntry, pEntry );

        if ( Base < 0 )
            continue;

        for ( i = 0; i < pSCHashTable->pFxchMan->nSizeOutputID; i++ )
            Result += Fxch_CountOnes( pOutputID0[i] & pOutputID1[i] );

        for ( z = 0; z < Result; z++ )
            iDiv = Fxch_DivRemove( pSCHashTable->pFxchMan, fUpdate, 0, Base );

        vDivCubePairs = Vec_WecEntry( pSCHashTable->pFxchMan->vDivCubePairs, iDiv );
        Vec_IntForEachEntryDouble( vDivCubePairs, iCube0, iCube1, i )
            if ( ( iCube0 == (int)pNextEntry->iCube && iCube1 == (int)pEntry->iCube )  ||
                 ( iCube0 == (int)pEntry->iCube && iCube1 == (int)pNextEntry->iCube ) )
            {
                Vec_IntDrop( vDivCubePairs, i+1 );
                Vec_IntDrop( vDivCubePairs, i );
            }
        if ( Vec_IntSize( vDivCubePairs ) == 0 )
            Vec_IntErase( vDivCubePairs );

        Pairs++;
    }

    memmove(pBin->vSCData + iEntry, pBin->vSCData + iEntry + 1, (pBin->Size - iEntry - 1) * sizeof(*pBin->vSCData));
    pBin->Size -= 1;

    return Pairs;
}